

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

GCproto * fs_finish(LexState *ls,BCLine line)

{
  MSize sz;
  uint8_t *puVar1;
  SBuf *sb;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  BCPos BVar5;
  int iVar6;
  FuncState *fs;
  lua_State *L;
  BCInsLine *pBVar7;
  VarInfo *pVVar8;
  uint64_t uVar9;
  char *pcVar10;
  GCtab *pGVar11;
  TValue *pTVar12;
  uint uVar13;
  uint uVar14;
  BCPos BVar15;
  long lVar16;
  GCobj *o;
  ptrdiff_t argbase;
  byte bVar17;
  ulong uVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  VarInfo *pVVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  TValue *pTVar28;
  void *__dest;
  int iVar29;
  char *pcVar30;
  GCobj *v;
  long lVar31;
  ulong uVar32;
  
  fs = ls->fs;
  iVar29 = line - fs->linedefined;
  L = ls->L;
  uVar3 = fs->pc;
  if (((uVar3 <= fs->lasttarget) || (uVar13 = (byte)fs->bcbase[uVar3 - 1].ins - 0x43, 9 < uVar13))
     || ((0x3c3U >> (uVar13 & 0x1f) & 1) == 0)) {
    if ((fs->bl->flags & 8) != 0) {
      bcemit_INS(fs,0x80000032);
    }
    bcemit_INS(fs,0x1004b);
  }
  puVar1 = &fs->bl->flags;
  *puVar1 = *puVar1 | 0x10;
  fscope_end(fs);
  if ((1 < uVar3) && ((fs->flags & 0x40) != 0)) {
    iVar24 = 0x7ffe;
    lVar31 = 0;
    do {
      uVar13 = fs->bcbase[lVar31 + 1].ins;
      uVar14 = (uVar13 & 0xff) - 0x32;
      if (uVar14 < 0x1b) {
        if ((0x7860000U >> (uVar14 & 0x1f) & 1) == 0) {
          if (uVar14 == 0) break;
        }
        else {
          BVar15 = bcemit_INS(fs,uVar13);
          pBVar7 = fs->bcbase;
          pBVar7[BVar15].line = pBVar7[lVar31 + 1].line;
          if (0xffff < BVar15 + iVar24) {
            err_syntax(fs->ls,LJ_ERR_XFIXUP);
          }
          pBVar7[lVar31 + 1].ins = (BVar15 + iVar24) * 0x10000 | 0x32;
        }
      }
      iVar24 = iVar24 + -1;
      lVar31 = lVar31 + 1;
    } while ((ulong)uVar3 - 1 != lVar31);
  }
  uVar3 = fs->pc;
  uVar13 = fs->nkn;
  uVar21 = (ulong)fs->nkgc * 8 + (ulong)uVar3 * 4 + 0x6f & 0xffffffff8;
  lVar31 = uVar21 + (ulong)uVar13 * 8;
  bVar17 = fs->nuv;
  uVar18 = (ulong)((uint)bVar17 * 2 + 2 & 0xfffffffc);
  bVar20 = 2 - (iVar29 < 0x10000);
  if (iVar29 < 0x100) {
    bVar20 = 0;
  }
  sb = &ls->sb;
  pVVar8 = ls->vstack;
  (ls->sb).w = (ls->sb).b;
  if (bVar17 != 0) {
    uVar32 = 0;
    do {
      uVar9 = pVVar8[fs->uvmap[uVar32]].name.gcptr64;
      uVar14 = *(int *)(uVar9 + 0x14) + 1;
      pcVar30 = (ls->sb).w;
      if ((uint)(*(int *)&(ls->sb).e - (int)pcVar30) < uVar14) {
        pcVar30 = lj_buf_more2(sb,uVar14);
      }
      memcpy(pcVar30,(void *)(uVar9 + 0x18),(ulong)uVar14);
      sb->w = pcVar30 + uVar14;
      uVar32 = uVar32 + 1;
    } while (bVar17 != uVar32);
  }
  lVar16 = uVar18 + lVar31;
  iVar24 = *(int *)&(ls->sb).w;
  uVar14 = ls->vtop;
  iVar4 = *(int *)&(ls->sb).b;
  if (fs->vbase < uVar14) {
    pVVar22 = pVVar8 + fs->vbase;
    BVar15 = 0;
    do {
      if ((pVVar22->info & 6) == 0) {
        uVar32 = (pVVar22->name).gcptr64;
        if (uVar32 < 7) {
          pcVar30 = (ls->sb).w;
          if ((uint)(*(int *)&(ls->sb).e - (int)pcVar30) < 0xb) {
            pcVar30 = lj_buf_more2(sb,0xb);
          }
          *pcVar30 = (char)uVar32;
          pcVar30 = pcVar30 + 1;
        }
        else {
          iVar6 = *(int *)(uVar32 + 0x14);
          sz = iVar6 + 0xb;
          pcVar30 = (ls->sb).w;
          if ((uint)(*(int *)&(ls->sb).e - (int)pcVar30) < sz) {
            pcVar30 = lj_buf_more2(sb,sz);
          }
          uVar25 = (ulong)(iVar6 + 1);
          memcpy(pcVar30,(void *)(uVar32 + 0x18),uVar25);
          pcVar30 = pcVar30 + uVar25;
        }
        BVar5 = pVVar22->startpc;
        pcVar30 = lj_strfmt_wuleb128(pcVar30,BVar5 - BVar15);
        pcVar30 = lj_strfmt_wuleb128(pcVar30,pVVar22->endpc - BVar5);
        sb->w = pcVar30;
        BVar15 = BVar5;
      }
      pVVar22 = pVVar22 + 1;
    } while (pVVar22 < pVVar8 + uVar14);
  }
  lVar23 = (ulong)(uVar3 - 1 << (bVar20 & 0x1f)) + lVar16;
  pcVar30 = (ls->sb).w;
  if (*(int *)&(ls->sb).e == (int)pcVar30) {
    pcVar30 = lj_buf_more2(sb,1);
  }
  *pcVar30 = '\0';
  pcVar30 = pcVar30 + 1;
  (ls->sb).w = pcVar30;
  pcVar10 = (ls->sb).b;
  o = (GCobj *)lj_mem_newgco(L,(ulong)(pcVar30 + (lVar23 - (long)pcVar10)) & 0xffffffff);
  (o->gch).gct = '\a';
  (o->pt).sizept = (MSize)(pcVar30 + (lVar23 - (long)pcVar10));
  (o->pt).trace = 0;
  bVar17 = fs->flags;
  (o->pt).flags = bVar17 & 0x9f;
  (o->gch).unused1 = fs->numparams;
  bVar20 = fs->framesize;
  (o->gch).unused2 = bVar20;
  (o->th).openupval.gcptr64 = (uint64_t)ls->chunkname;
  pTVar28 = (TValue *)((long)o + uVar21);
  pTVar28[-(ulong)(fs->nkgc + 1)].field_4.i = 0;
  uVar3 = fs->pc;
  bVar17 = (bVar17 & 2) >> 1;
  pBVar7 = fs->bcbase;
  (o->str).sid = uVar3;
  *(uint *)&(o->th).exdata2 = (uint)bVar17 + (uint)bVar17 * 2 + (uint)bVar20 * 0x100 + 0x59;
  if (1 < (ulong)uVar3) {
    lVar19 = 0;
    do {
      *(BCIns *)((long)o + lVar19 * 4 + 0x6c) = pBVar7[lVar19 + 1].ins;
      lVar19 = lVar19 + 1;
    } while ((ulong)uVar3 - 1 != lVar19);
  }
  uVar3 = fs->nkn;
  if ((uVar3 < 0x10001) && (uVar14 = fs->nkgc, uVar14 < 0x10001)) {
    (o->th).base = pTVar28;
    (o->pt).sizekn = uVar3;
    (o->pt).sizekgc = uVar14;
    pGVar11 = fs->kt;
    if (pGVar11->asize != 0) {
      uVar9 = (pGVar11->array).ptr64;
      uVar32 = 0;
      do {
        if (*(int *)(uVar9 + 4 + uVar32 * 8) == 0) {
          pTVar28[*(uint *)(uVar9 + uVar32 * 8)].n = (double)(uVar32 & 0xffffffff);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 < pGVar11->asize);
    }
    lVar19 = (ulong)uVar13 * 8;
    uVar9 = (pGVar11->node).ptr64;
    uVar3 = pGVar11->hmask;
    uVar32 = 0;
    do {
      if (*(int *)(uVar9 + 4 + uVar32 * 0x18) == 0) {
        puVar2 = (uint *)(uVar9 + uVar32 * 0x18);
        uVar25 = *(ulong *)(puVar2 + 2);
        if ((ushort)(uVar25 >> 0x30) < 0xfff9) {
          pTVar28[*puVar2].u64 = uVar25;
        }
        else {
          v = (GCobj *)(uVar25 & 0x7fffffffffff);
          pTVar28[~(ulong)*puVar2].u64 = (uint64_t)v;
          if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
            lj_gc_barrierf((global_State *)(fs->L->glref).ptr64,o,v);
          }
          if (((*(ulong *)(puVar2 + 2) & 0xffff800000000000) == 0xfffc000000000000) &&
             (bVar17 = (v->pt).sizeuv, (ulong)bVar17 != 0)) {
            pVVar8 = fs->ls->vstack;
            pTVar12 = (v->th).top;
            uVar25 = 0;
            do {
              uVar26 = *(ushort *)((long)pTVar12 + uVar25 * 2);
              uVar27 = (ulong)uVar26;
              if (uVar27 < 0xff88) {
                uVar26 = (ushort)pVVar8[uVar27].slot;
                if ((pVVar8[uVar27].info & 1) == 0) {
                  uVar26 = uVar26 | 0xc000;
                }
                else {
                  uVar26 = uVar26 | 0x8000;
                }
              }
              else {
                uVar26 = uVar26 + 0x78;
              }
              *(ushort *)((long)pTVar12 + uVar25 * 2) = uVar26;
              uVar25 = uVar25 + 1;
            } while (bVar17 != uVar25);
          }
        }
      }
      uVar13 = (int)uVar32 + 1;
      uVar32 = (ulong)uVar13;
    } while (uVar13 <= uVar3);
    pTVar28 = (TValue *)(lVar31 + (long)o);
    (o->th).top = pTVar28;
    bVar17 = fs->nuv;
    (o->pt).sizeuv = bVar17;
    memcpy(pTVar28,fs->uvtmp,(ulong)((uint)bVar17 * 2));
    iVar6 = fs->linedefined;
    uVar32 = (ulong)((fs->pc - 1) + (uint)(fs->pc == 1));
    pBVar7 = fs->bcbase;
    (o->pt).firstline = iVar6;
    (o->pt).numline = iVar29;
    (o->th).cframe = (void *)(lVar16 + (long)o);
    if (iVar29 < 0x100) {
      uVar25 = 0;
      do {
        *(char *)((long)o + uVar25 + uVar21 + lVar19 + uVar18) =
             (char)pBVar7[uVar25 + 1].line - (char)iVar6;
        uVar25 = uVar25 + 1;
      } while (uVar32 != uVar25);
    }
    else if (iVar29 < 0x10000) {
      uVar25 = 0;
      do {
        *(short *)((long)o + uVar25 * 2 + uVar21 + lVar19 + uVar18) =
             (short)pBVar7[uVar25 + 1].line - (short)iVar6;
        uVar25 = uVar25 + 1;
      } while (uVar32 != uVar25);
    }
    else {
      uVar25 = 0;
      do {
        *(BCLine *)((long)o + uVar25 * 4 + uVar21 + lVar19 + uVar18) =
             pBVar7[uVar25 + 1].line - iVar6;
        uVar25 = uVar25 + 1;
      } while (uVar32 != uVar25);
    }
    __dest = (void *)(lVar23 + (long)o);
    *(void **)&(o->th).stacksize = __dest;
    (o->th).exdata = (void *)((ulong)(uint)(iVar24 - iVar4) + (long)__dest);
    pcVar30 = (ls->sb).b;
    memcpy(__dest,pcVar30,(ulong)(uint)(*(int *)&(ls->sb).w - (int)pcVar30));
    if (((*(byte *)((L->glref).ptr64 + 0x93) & 1) != 0) &&
       (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_BC), argbase != 0)) {
      pTVar28 = L->top;
      L->top = pTVar28 + 1;
      pTVar28->u64 = (ulong)o | 0xfffc000000000000;
      lj_vmevent_call(L,argbase);
    }
    L->top = L->top + -1;
    ls->vtop = fs->vbase;
    ls->fs = fs->prev;
    return (GCproto *)o;
  }
  err_limit(fs,0x10000,"constants");
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}